

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O1

void h2v2_merged_upsample_565D
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  ulong uVar10;
  ushort *puVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  byte *pbVar26;
  long lVar27;
  ushort *puVar28;
  byte *local_90;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar12 = *(long *)&pjVar5[1].need_context_rows;
  p_Var8 = pjVar5[2].start_pass;
  p_Var9 = pjVar5[2].upsample;
  uVar4 = cinfo->output_width;
  uVar24 = dither_matrix[cinfo->output_scanline & 3];
  uVar19 = dither_matrix[cinfo->output_scanline + 1 & 3];
  pbVar26 = (*input_buf)[in_row_group_ctr * 2];
  local_90 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
  pbVar20 = input_buf[1][in_row_group_ctr];
  pbVar14 = input_buf[2][in_row_group_ctr];
  puVar11 = (ushort *)*output_buf;
  puVar28 = (ushort *)output_buf[1];
  if (1 < uVar4) {
    lVar22 = 0;
    lVar17 = 0;
    lVar25 = 0;
    do {
      lVar16 = (long)*(int *)(p_Var7 + (ulong)pbVar14[lVar25] * 4);
      lVar15 = (long)*(int *)(lVar12 + (ulong)pbVar20[lVar25] * 4);
      uVar10 = (ulong)pbVar26[lVar25 * 2];
      uVar21 = uVar24 & 0xff;
      lVar27 = (long)(int)((ulong)(*(long *)(p_Var8 + (ulong)pbVar14[lVar25] * 8) +
                                  *(long *)(p_Var9 + (ulong)pbVar20[lVar25] * 8)) >> 0x10);
      uVar18 = (uint)(uVar24 >> 8);
      uVar13 = (ulong)pbVar26[lVar25 * 2 + 1];
      uVar23 = uVar24 >> 8 & 0xff;
      bVar1 = pJVar6[uVar13 + lVar27 + (uVar23 >> 1)];
      bVar2 = pJVar6[lVar16 + uVar13 + uVar23];
      uVar24 = (ulong)((uVar18 & 0xffff00 | (int)uVar24 << 0x18) >> 8 | uVar18 << 0x18);
      bVar3 = pJVar6[uVar13 + lVar15 + uVar23];
      puVar11[lVar25 * 2] =
           (ushort)(pJVar6[uVar10 + lVar15 + uVar21] >> 3) |
           (pJVar6[lVar16 + uVar10 + uVar21] & 0xfff8) * 0x100 +
           (pJVar6[uVar10 + lVar27 + (uVar21 >> 1)] & 0xfc) * 8;
      puVar11[lVar25 * 2 + 1] = (ushort)(bVar3 >> 3) | (bVar2 & 0xfff8) * 0x100 + (bVar1 & 0xfc) * 8
      ;
      uVar10 = (ulong)local_90[lVar25 * 2];
      uVar13 = uVar19 & 0xff;
      uVar18 = (uint)(uVar19 >> 8);
      uVar21 = (ulong)local_90[lVar25 * 2 + 1];
      uVar23 = uVar19 >> 8 & 0xff;
      bVar1 = pJVar6[lVar27 + uVar21 + (uVar23 >> 1)];
      bVar2 = pJVar6[lVar16 + uVar21 + uVar23];
      bVar3 = pJVar6[lVar15 + uVar21 + uVar23];
      uVar19 = (ulong)((uVar18 & 0xffff00 | (int)uVar19 << 0x18) >> 8 | uVar18 << 0x18);
      puVar28[lVar25 * 2] =
           (ushort)(pJVar6[uVar10 + lVar15 + uVar13] >> 3) |
           (pJVar6[lVar16 + uVar10 + uVar13] & 0xfff8) * 0x100 +
           (pJVar6[uVar10 + lVar27 + (uVar13 >> 1)] & 0xfc) * 8;
      puVar28[lVar25 * 2 + 1] = (ushort)(bVar3 >> 3) | (bVar2 & 0xfff8) * 0x100 + (bVar1 & 0xfc) * 8
      ;
      lVar25 = lVar25 + 1;
      lVar17 = lVar17 + -2;
      lVar22 = lVar22 + -4;
    } while (uVar4 >> 1 != (uint)lVar25);
    pbVar14 = pbVar14 + lVar25;
    pbVar20 = pbVar20 + lVar25;
    local_90 = local_90 + -lVar17;
    pbVar26 = pbVar26 + -lVar17;
    puVar28 = (ushort *)((long)puVar28 - lVar22);
    puVar11 = (ushort *)((long)puVar11 - lVar22);
  }
  if ((uVar4 & 1) != 0) {
    lVar17 = (long)*(int *)(p_Var7 + (ulong)*pbVar14 * 4);
    lVar12 = (long)*(int *)(lVar12 + (ulong)*pbVar20 * 4);
    uVar10 = (ulong)*pbVar26;
    uVar24 = uVar24 & 0xff;
    lVar22 = (long)(int)((ulong)(*(long *)(p_Var8 + (ulong)*pbVar14 * 8) +
                                *(long *)(p_Var9 + (ulong)*pbVar20 * 8)) >> 0x10);
    *puVar11 = (ushort)(pJVar6[uVar10 + lVar12 + uVar24] >> 3) |
               (pJVar6[lVar17 + uVar10 + uVar24] & 0xfff8) * 0x100 +
               (pJVar6[uVar10 + lVar22 + (uVar24 >> 1)] & 0xfc) * 8;
    uVar24 = (ulong)*local_90;
    uVar19 = uVar19 & 0xff;
    *puVar28 = (ushort)(pJVar6[lVar12 + uVar24 + uVar19] >> 3) |
               (pJVar6[lVar17 + uVar24 + uVar19] & 0xfff8) * 0x100 +
               (pJVar6[lVar22 + uVar24 + (uVar19 >> 1)] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample_565D(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                          JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v2_merged_upsample_565D_be(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
  else
    h2v2_merged_upsample_565D_le(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
}